

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O1

int ext_loader_impl_clear(loader_impl impl,loader_handle handle)

{
  undefined8 *puVar1;
  dynlink_symbol_addr p_Var2;
  int iVar3;
  long lVar4;
  mapped_type *pmVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  lVar4 = loader_impl_get();
  iVar3 = 1;
  if (handle != (loader_handle)0x0 && lVar4 != 0) {
    lVar7 = *handle;
    if (*(long *)((long)handle + 8) != lVar7) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        log_write_impl_va("metacall",0x14c,"ext_loader_impl_clear",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/ext_loader/source/ext_loader_impl.cpp"
                          ,0,"Storing handle: %s <%p> in destroy list",
                          *(undefined8 *)(lVar7 + lVar6),*(undefined8 *)(lVar7 + 0x20 + lVar6));
        lVar7 = *handle;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
                               *)(lVar4 + 0x30),(key_type *)(lVar7 + lVar6));
        std::__cxx11::string::_M_assign((string *)pmVar5);
        puVar1 = (undefined8 *)(lVar7 + 0x20 + lVar6);
        p_Var2 = (dynlink_symbol_addr)puVar1[1];
        pmVar5->handle = (dynlink)*puVar1;
        pmVar5->addr = p_Var2;
        std::
        vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
        _M_erase((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
                  *)handle,(loader_impl_ext_handle_lib_type *)(*handle + lVar6));
        uVar8 = uVar8 + 1;
        lVar7 = *handle;
        lVar6 = lVar6 + 0x30;
      } while (uVar8 < (ulong)((*(long *)((long)handle + 8) - lVar7 >> 4) * -0x5555555555555555));
    }
    std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
    ~vector((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
             *)handle);
    operator_delete(handle,0x18);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ext_loader_impl_clear(loader_impl impl, loader_handle handle)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl == NULL)
	{
		return 1;
	}

	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	if (ext_handle != NULL)
	{
		for (size_t i = 0; i < ext_handle->extensions.size(); i++)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Storing handle: %s <%p> in destroy list", ext_handle->extensions[i].name.c_str(), ext_handle->extensions[i].handle);
			ext_impl->destroy_list[ext_handle->extensions[i].name] = ext_handle->extensions[i];
			ext_handle->extensions.erase(ext_handle->extensions.begin() + i);
		}

		delete ext_handle;

		return 0;
	}

	return 1;
}